

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void DoIt(int maxIntensityBinIdx,bool hasIntensityUncertainty,char *binFileName,char *idxFileName,
         bool uncompressedSize,bool zip,bool validationCheck)

{
  Validate *this;
  FootprintToBin fTB;
  
  FootprintToBin::FootprintToBin
            (&fTB,maxIntensityBinIdx,hasIntensityUncertainty,binFileName,idxFileName,
             uncompressedSize,zip,validationCheck);
  this = &fTB.super_ValidateFootprint.super_Validate;
  Validate::SkipHeaderRow(this);
  FootprintToBin::WriteHeader(&fTB);
  if (validationCheck) {
    ValidateFootprint::ReadFootprintFile(&fTB.super_ValidateFootprint);
    Validate::PrintSuccessMessage(this);
  }
  else {
    FootprintToBin::ReadFootprintFileNoChecks(&fTB);
  }
  FootprintToBin::~FootprintToBin(&fTB);
  return;
}

Assistant:

void DoIt(const int maxIntensityBinIdx, const bool hasIntensityUncertainty,
	  const char* binFileName, const char* idxFileName,
	  const bool uncompressedSize, const bool zip,
	  const bool validationCheck) {

  FootprintToBin fTB(maxIntensityBinIdx, hasIntensityUncertainty, binFileName,
		     idxFileName, uncompressedSize, zip, validationCheck);
  fTB.SkipHeaderRow();
  fTB.WriteHeader();

  if (validationCheck) {

    fTB.ReadFootprintFile();
    fTB.PrintSuccessMessage();

    return;

  }

  fTB.ReadFootprintFileNoChecks();

}